

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cLua.cpp
# Opt level: O1

void __thiscall CLua::CLua(CLua *this)

{
  lua_State *plVar1;
  
  this->_vptr_CLua = (_func_int **)&PTR__CLua_00138c40;
  plVar1 = luaL_newstate();
  this->m_pScriptContext = plVar1;
  this->mpScriptHome = (char *)0x0;
  SetHome(this,"./scripts/");
  this->m_pErrorHandler = defaultErrorHandler;
  luaL_openselectedlibs(this->m_pScriptContext,-1,0);
  AddFunction(this,DebugGlue);
  return;
}

Assistant:

CLua::CLua()
{
   m_pScriptContext = luaL_newstate();
   mpScriptHome = 0;
   SetHome(spDefaultScriptHome);

   m_pErrorHandler = defaultErrorHandler;

   luaL_openlibs(m_pScriptContext);
   AddFunction(DebugGlue);
}